

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O3

labsEndpoint_t *
ssllabs::Endpoint::parseEndpointData
          (labsEndpoint_t *__return_storage_ptr__,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *obj)

{
  _Rb_tree_header *p_Var1;
  
  (__return_storage_ptr__->IpAddress)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->IpAddress).field_2;
  (__return_storage_ptr__->IpAddress)._M_string_length = 0;
  (__return_storage_ptr__->IpAddress).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ServerName)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ServerName).field_2;
  (__return_storage_ptr__->ServerName)._M_string_length = 0;
  (__return_storage_ptr__->ServerName).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->StatusMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->StatusMessage).field_2;
  (__return_storage_ptr__->StatusMessage)._M_string_length = 0;
  (__return_storage_ptr__->StatusMessage).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->StatusDetailMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->StatusDetailMessage).field_2;
  (__return_storage_ptr__->StatusDetailMessage)._M_string_length = 0;
  (__return_storage_ptr__->StatusDetailMessage).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Grade)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Grade).field_2;
  (__return_storage_ptr__->Grade)._M_string_length = 0;
  (__return_storage_ptr__->Grade).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->GradeTrustIgnored)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->GradeTrustIgnored).field_2;
  (__return_storage_ptr__->GradeTrustIgnored)._M_string_length = 0;
  (__return_storage_ptr__->GradeTrustIgnored).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->HasWarnings = false;
  __return_storage_ptr__->IsExceptional = false;
  __return_storage_ptr__->Progress = 0;
  __return_storage_ptr__->Duration = 0;
  __return_storage_ptr__->Eta = 0;
  __return_storage_ptr__->Delegation = 0;
  (__return_storage_ptr__->Details).HostStartTime = 0;
  (__return_storage_ptr__->Details).Key.Size = 0;
  (__return_storage_ptr__->Details).Key.Strength = 0;
  (__return_storage_ptr__->Details).Key.Algorithm._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).Key.Algorithm.field_2;
  (__return_storage_ptr__->Details).Key.Algorithm._M_string_length = 0;
  (__return_storage_ptr__->Details).Key.Algorithm.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).Key.DebianFlaw = false;
  (__return_storage_ptr__->Details).Key.Q = 0;
  (__return_storage_ptr__->Details).Cert.Subject._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).Cert.Subject.field_2;
  (__return_storage_ptr__->Details).Cert.Subject._M_string_length = 0;
  (__return_storage_ptr__->Details).Cert.Subject.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).Cert.NotBefore = 0;
  (__return_storage_ptr__->Details).Cert.NotAfter = 0;
  (__return_storage_ptr__->Details).Cert.AltNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.AltNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.CommonNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.AltNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.CommonNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.CommonNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.IssuerSubject._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).Cert.IssuerSubject.field_2;
  (__return_storage_ptr__->Details).Cert.IssuerSubject._M_string_length = 0;
  (__return_storage_ptr__->Details).Cert.IssuerSubject.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).Cert.SigAlg._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).Cert.SigAlg.field_2;
  (__return_storage_ptr__->Details).Cert.SigAlg._M_string_length = 0;
  (__return_storage_ptr__->Details).Cert.SigAlg.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).Cert.IssuerLabel._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).Cert.IssuerLabel.field_2;
  (__return_storage_ptr__->Details).Cert.IssuerLabel._M_string_length = 0;
  (__return_storage_ptr__->Details).Cert.IssuerLabel.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).Cert.RevocationInfo = 0;
  (__return_storage_ptr__->Details).Cert.CrlURIs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.CrlURIs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.CrlURIs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.OcspURIs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.OcspURIs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.OcspURIs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.RevocationStatus = 0;
  (__return_storage_ptr__->Details).Cert.CrlRevocationStatus = 0;
  (__return_storage_ptr__->Details).Cert.OcspRevocationStatus = 0;
  (__return_storage_ptr__->Details).Cert.Sgc = 0;
  (__return_storage_ptr__->Details).Cert.ValidationType._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).Cert.ValidationType.field_2;
  (__return_storage_ptr__->Details).Cert.ValidationType._M_string_length = 0;
  (__return_storage_ptr__->Details).Cert.ValidationType.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).Cert.Issues = 0;
  (__return_storage_ptr__->Details).Cert.Sct = false;
  (__return_storage_ptr__->Details).Cert.MustStaple = 0;
  (__return_storage_ptr__->Details).Cert.Sha1Hash._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).Cert.Sha1Hash.field_2;
  (__return_storage_ptr__->Details).Cert.Sha1Hash._M_string_length = 0;
  (__return_storage_ptr__->Details).Cert.Sha1Hash.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).Cert.PinSha256._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).Cert.PinSha256.field_2;
  (__return_storage_ptr__->Details).Cert.PinSha256._M_string_length = 0;
  (__return_storage_ptr__->Details).Cert.PinSha256.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->Details).Chain.Certs.
           super__Vector_base<ssllabs::labsChainCert,_std::allocator<ssllabs::labsChainCert>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->Details).Chain.Certs.
           super__Vector_base<ssllabs::labsChainCert,_std::allocator<ssllabs::labsChainCert>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->Details).Chain.Certs.
  super__Vector_base<ssllabs::labsChainCert,_std::allocator<ssllabs::labsChainCert>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Chain.Certs.
  super__Vector_base<ssllabs::labsChainCert,_std::allocator<ssllabs::labsChainCert>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).Suites.Preference = false;
  (__return_storage_ptr__->Details).Suites.List.
  super__Vector_base<ssllabs::labsSuite,_std::allocator<ssllabs::labsSuite>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).Suites.List.
  super__Vector_base<ssllabs::labsSuite,_std::allocator<ssllabs::labsSuite>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Details).Protocols.
  super__Vector_base<ssllabs::labsProtocol,_std::allocator<ssllabs::labsProtocol>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Details).Suites.List.
  super__Vector_base<ssllabs::labsSuite,_std::allocator<ssllabs::labsSuite>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Protocols.
  super__Vector_base<ssllabs::labsProtocol,_std::allocator<ssllabs::labsProtocol>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Protocols.
  super__Vector_base<ssllabs::labsProtocol,_std::allocator<ssllabs::labsProtocol>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).ServerSignature._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).ServerSignature.field_2;
  (__return_storage_ptr__->Details).ServerSignature._M_string_length = 0;
  (__return_storage_ptr__->Details).ServerSignature.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).PrefixDelegation = false;
  (__return_storage_ptr__->Details).NonPrefixDelegation = false;
  (__return_storage_ptr__->Details).VulnBeast = false;
  *(undefined8 *)((long)&(__return_storage_ptr__->Details).SessionResumption + 1) = 0;
  (__return_storage_ptr__->Details).RenegSupport = 0;
  (__return_storage_ptr__->Details).SessionResumption = 0;
  (__return_storage_ptr__->Details).NpnProtocols._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).NpnProtocols.field_2;
  (__return_storage_ptr__->Details).NpnProtocols._M_string_length = 0;
  (__return_storage_ptr__->Details).NpnProtocols.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).SessionTickets = 0;
  (__return_storage_ptr__->Details).OcspStapling = false;
  (__return_storage_ptr__->Details).StaplingRevocationStatus = 0;
  (__return_storage_ptr__->Details).StaplingRevocationErrorMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).StaplingRevocationErrorMessage.field_2;
  (__return_storage_ptr__->Details).StaplingRevocationErrorMessage._M_string_length = 0;
  (__return_storage_ptr__->Details).StaplingRevocationErrorMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).SniRequired = false;
  (__return_storage_ptr__->Details).HttpStatusCode = 0;
  (__return_storage_ptr__->Details).HttpForwarding._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).HttpForwarding.field_2;
  (__return_storage_ptr__->Details).HttpForwarding._M_string_length = 0;
  (__return_storage_ptr__->Details).HttpForwarding.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).OpenSslCcs = 0;
  (__return_storage_ptr__->Details).Poodle = false;
  (__return_storage_ptr__->Details).PoodleTls = 0;
  (__return_storage_ptr__->Details).FallbackScsv = false;
  (__return_storage_ptr__->Details).Freak = false;
  (__return_storage_ptr__->Details).HstsPolicy.LONG_MAX_AGE = 0;
  *(undefined4 *)((long)&(__return_storage_ptr__->Details).ForwardSecrecy + 3) = 0;
  (__return_storage_ptr__->Details).ForwardSecrecy = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->Details).Sims.Results.
           super__Vector_base<ssllabs::labsSimulation,_std::allocator<ssllabs::labsSimulation>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->Details).Sims.Results.
           super__Vector_base<ssllabs::labsSimulation,_std::allocator<ssllabs::labsSimulation>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (__return_storage_ptr__->Details).Sims.Results.
  super__Vector_base<ssllabs::labsSimulation,_std::allocator<ssllabs::labsSimulation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Sims.Results.
  super__Vector_base<ssllabs::labsSimulation,_std::allocator<ssllabs::labsSimulation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined4 *)((long)&(__return_storage_ptr__->Details).DhUsesKnownPrimes + 3) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->Details).DhPrimes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->Details).DhPrimes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)&(__return_storage_ptr__->Details).HasSct = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->Details).DhPrimes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (__return_storage_ptr__->Details).HstsPolicy.Header._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).HstsPolicy.Header.field_2;
  (__return_storage_ptr__->Details).HstsPolicy.Header._M_string_length = 0;
  (__return_storage_ptr__->Details).HstsPolicy.Header.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).HstsPolicy.Status._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).HstsPolicy.Status.field_2;
  (__return_storage_ptr__->Details).HstsPolicy.Status._M_string_length = 0;
  (__return_storage_ptr__->Details).HstsPolicy.Status.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).HstsPolicy.Error._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).HstsPolicy.Error.field_2;
  (__return_storage_ptr__->Details).HstsPolicy.Error._M_string_length = 0;
  (__return_storage_ptr__->Details).HstsPolicy.Error.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).HstsPolicy.MaxAge = 0;
  (__return_storage_ptr__->Details).HstsPolicy.IncludeSubDomains = false;
  (__return_storage_ptr__->Details).HstsPolicy.Preload = false;
  p_Var1 = &(__return_storage_ptr__->Details).HstsPolicy.Directives._M_t._M_impl.
            super__Rb_tree_header;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->Details).HstsPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(undefined8 *)&(__return_storage_ptr__->Details).HstsPolicy.Directives._M_t._M_impl = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->Details).HstsPolicy.Directives._M_t._M_impl.super__Rb_tree_header.
    _M_header = 0;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->Details).HstsPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->Details).HstsPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (__return_storage_ptr__->Details).HstsPreloads.
  super__Vector_base<ssllabs::labsHstsPreload,_std::allocator<ssllabs::labsHstsPreload>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).HstsPreloads.
  super__Vector_base<ssllabs::labsHstsPreload,_std::allocator<ssllabs::labsHstsPreload>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Details).HstsPolicy.Directives._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (__return_storage_ptr__->Details).HstsPreloads.
  super__Vector_base<ssllabs::labsHstsPreload,_std::allocator<ssllabs::labsHstsPreload>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpPolicy.Header._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).HpkpPolicy.Header.field_2;
  (__return_storage_ptr__->Details).HpkpPolicy.Header._M_string_length = 0;
  (__return_storage_ptr__->Details).HpkpPolicy.Header.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).HpkpPolicy.Status._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).HpkpPolicy.Status.field_2;
  (__return_storage_ptr__->Details).HpkpPolicy.Status._M_string_length = 0;
  (__return_storage_ptr__->Details).HpkpPolicy.Status.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).HpkpPolicy.Error._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).HpkpPolicy.Error.field_2;
  (__return_storage_ptr__->Details).HpkpPolicy.Error._M_string_length = 0;
  (__return_storage_ptr__->Details).HpkpPolicy.Error.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).HpkpPolicy.MaxAge = 0;
  (__return_storage_ptr__->Details).HpkpPolicy.IncludeSubDomains = false;
  (__return_storage_ptr__->Details).HpkpPolicy.ReportUri._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).HpkpPolicy.ReportUri.field_2;
  (__return_storage_ptr__->Details).HpkpPolicy.ReportUri._M_string_length = 0;
  (__return_storage_ptr__->Details).HpkpPolicy.ReportUri.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->Details).HpkpPolicy.Directives._M_t._M_impl.
            super__Rb_tree_header;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->Details).HpkpPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(undefined8 *)&(__return_storage_ptr__->Details).HpkpPolicy.Directives._M_t._M_impl = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->Details).HpkpPolicy.Directives._M_t._M_impl.super__Rb_tree_header.
    _M_header = 0;
  (__return_storage_ptr__->Details).HpkpPolicy.MatchedPins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpPolicy.MatchedPins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpPolicy.Pins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpPolicy.MatchedPins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpPolicy.Pins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpPolicy.Pins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->Details).HpkpPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->Details).HpkpPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (__return_storage_ptr__->Details).HpkpPolicy.Directives._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.Header._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).HpkpRoPolicy.Header.field_2;
  (__return_storage_ptr__->Details).HpkpRoPolicy.Header._M_string_length = 0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.Header.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).HpkpRoPolicy.Status._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).HpkpRoPolicy.Status.field_2;
  (__return_storage_ptr__->Details).HpkpRoPolicy.Status._M_string_length = 0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.Status.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).HpkpRoPolicy.Error._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).HpkpRoPolicy.Error.field_2;
  (__return_storage_ptr__->Details).HpkpRoPolicy.Error._M_string_length = 0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.Error.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Details).HpkpRoPolicy.MaxAge = 0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.IncludeSubDomains = false;
  (__return_storage_ptr__->Details).HpkpRoPolicy.ReportUri._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Details).HpkpRoPolicy.ReportUri.field_2;
  (__return_storage_ptr__->Details).HpkpRoPolicy.ReportUri._M_string_length = 0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.ReportUri.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->Details).HpkpRoPolicy.Directives._M_t._M_impl.
            super__Rb_tree_header;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->Details).HpkpRoPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(undefined8 *)&(__return_storage_ptr__->Details).HpkpRoPolicy.Directives._M_t._M_impl = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->Details).HpkpRoPolicy.Directives._M_t._M_impl.super__Rb_tree_header.
    _M_header = 0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.MatchedPins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.MatchedPins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.Pins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.MatchedPins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.Pins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.Pins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->Details).HpkpRoPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->Details).HpkpRoPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (__return_storage_ptr__->Details).HpkpRoPolicy.Directives._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (__return_storage_ptr__->Details).DrownErrors = false;
  (__return_storage_ptr__->Details).DrownVulnerable = false;
  parseEndpointData(obj,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

labsEndpoint_t Endpoint::parseEndpointData(const rapidjson::GenericValue<rapidjson::UTF8<char>,
            rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>> &obj) {
        labsEndpoint_t endpoint = {};

        parseEndpointData(obj, endpoint);
        return endpoint;
    }